

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O1

void * tc_malloc_skip_new_handler(size_t size)

{
  byte bVar1;
  int byte_size;
  bool bVar2;
  ThreadCache *this;
  FreeList *pFVar3;
  undefined8 *p;
  uint in_ECX;
  uint uVar4;
  size_t in_RSI;
  long in_FS_OFFSET;
  ThreadCachePtr TVar5;
  
  this = *(ThreadCache **)(in_FS_OFFSET + -8);
  if (this == (ThreadCache *)0x0) {
    TVar5 = tcmalloc::ThreadCachePtr::GetSlow();
    this = TVar5.ptr_;
  }
  if (size < 0x401) {
    in_ECX = (int)size + 7U >> 3;
LAB_0010fd9c:
    bVar2 = true;
  }
  else {
    if (size < 0x40001) {
      in_ECX = (int)size + 0x3c7fU >> 7;
      goto LAB_0010fd9c;
    }
    bVar2 = false;
  }
  if (bVar2) {
    bVar1 = (&tcmalloc::Static::sizemap_)[in_ECX];
    byte_size = this->list_[bVar1].size_;
    p = (undefined8 *)this->list_[bVar1].list_;
    if (p != (undefined8 *)0x0) {
      pFVar3 = this->list_ + bVar1;
      pFVar3->list_ = (void *)*p;
      uVar4 = pFVar3->length_ - 1;
      pFVar3->length_ = uVar4;
      if (uVar4 < pFVar3->lowater_) {
        pFVar3->lowater_ = uVar4;
      }
      if (p != (undefined8 *)0x0) {
        this->size_ = this->size_ - byte_size;
        goto LAB_0010fdf8;
      }
    }
    p = (undefined8 *)
        tcmalloc::ThreadCache::FetchFromCentralCache
                  (this,(uint)bVar1,byte_size,anon_unknown.dwarf_1759f::nop_oom_handler);
  }
  else {
    p = (undefined8 *)anon_unknown.dwarf_1759f::do_malloc_pages((ThreadCache *)size,in_RSI);
  }
LAB_0010fdf8:
  if (base::internal::new_hooks_ != 0) {
    tcmalloc::InvokeNewHookSlow(p,size);
  }
  return p;
}

Assistant:

PERFTOOLS_DLL_DECL void* tc_malloc_skip_new_handler(size_t size)  PERFTOOLS_NOTHROW {
  void* result = do_malloc(size);
  tcmalloc::InvokeNewHook(result, size);
  return result;
}